

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

uint Ivy_DecGetVar(Ivy_Dec_t *pNode,int iNum)

{
  int iNum_local;
  Ivy_Dec_t *pNode_local;
  
  if ((-1 < iNum) && (iNum < 6)) {
    switch(iNum) {
    case 0:
      pNode_local._4_4_ = (uint)*pNode >> 8 & 0xf;
      break;
    case 1:
      pNode_local._4_4_ = (uint)*pNode >> 0xc & 0xf;
      break;
    case 2:
      pNode_local._4_4_ = (uint)*pNode >> 0x10 & 0xf;
      break;
    case 3:
      pNode_local._4_4_ = (uint)*pNode >> 0x14 & 0xf;
      break;
    case 4:
      pNode_local._4_4_ = (uint)*pNode >> 0x18 & 0xf;
      break;
    case 5:
      pNode_local._4_4_ = (uint)*pNode >> 0x1c;
      break;
    default:
      pNode_local._4_4_ = 0xffffffff;
    }
    return pNode_local._4_4_;
  }
  __assert_fail("iNum >= 0 && iNum <= 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDsd.c"
                ,0x84,"unsigned int Ivy_DecGetVar(Ivy_Dec_t *, int)");
}

Assistant:

static inline unsigned   Ivy_DecGetVar( Ivy_Dec_t * pNode, int iNum )
{
    assert( iNum >= 0 && iNum <= 5 );
    switch( iNum )
    {
        case 0: return pNode->Fan0;
        case 1: return pNode->Fan1;
        case 2: return pNode->Fan2;
        case 3: return pNode->Fan3;
        case 4: return pNode->Fan4;
        case 5: return pNode->Fan5;
    }
    return ~0;
}